

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<const_kj::WritableFileMapping,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryFile::mmapWritable(InMemoryFile *this,uint64_t offset,uint64_t size)

{
  long lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  _func_int **pp_Var4;
  long in_RCX;
  WritableFileMapping *extraout_RDX;
  Own<const_kj::WritableFileMapping,_std::nullptr_t> OVar5;
  unsigned_long auStackY_100 [15];
  uint64_t end;
  Fault f;
  uint64_t offset_local;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  
  _kjCondition.right = &offset_local;
  end = in_RCX + size;
  _kjCondition.left = &end;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = size <= end;
  offset_local = size;
  if (_kjCondition.result) {
    _kjCondition.left = auStackY_100;
    kj::_::Mutex::lock((Mutex *)(offset + 0x18),0);
    Impl::ensureCapacity((Impl *)(offset + 0x30),end);
    uVar3 = offset_local;
    uVar2 = end;
    LOCK();
    *(int *)(offset + 0x10) = *(int *)(offset + 0x10) + 1;
    UNLOCK();
    lVar1 = *(long *)(offset + 0x38);
    pp_Var4 = (_func_int **)operator_new(0x28);
    *pp_Var4 = (_func_int *)&PTR_get_006e3f68;
    pp_Var4[1] = (_func_int *)(offset + 8);
    pp_Var4[2] = (_func_int *)offset;
    pp_Var4[3] = (_func_int *)(lVar1 + uVar3);
    pp_Var4[4] = (_func_int *)(uVar2 - uVar3);
    *(int *)(offset + 0x60) = *(int *)(offset + 0x60) + 1;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var4;
    kj::_::Mutex::unlock((Mutex *)(offset + 0x18),EXCLUSIVE,(Waiter *)0x0);
    OVar5.ptr = extraout_RDX;
    OVar5.disposer = (Disposer *)this;
    return OVar5;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[40]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x36a,FAILED,"end >= offset",
             "_kjCondition,\"mmapWritable() request overflows uint64\"",&_kjCondition,
             (char (*) [40])"mmapWritable() request overflows uint64");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    uint64_t end = offset + size;
    KJ_REQUIRE(end >= offset, "mmapWritable() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(end);
    return heap<WritableFileMappingImpl>(atomicAddRef(*this), lock->bytes.slice(offset, end));
  }